

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

int nng_stream_listener_alloc_url(nng_stream_listener **lp,nng_url *url)

{
  char *__s2;
  long lVar1;
  int iVar2;
  long lVar3;
  
  __s2 = url->u_scheme;
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x18 == 0x168) {
      return 9;
    }
    iVar2 = strcmp(*(char **)((long)&stream_drivers[0].scheme + lVar3),__s2);
    lVar1 = lVar3 + 0x18;
  } while (iVar2 != 0);
  iVar2 = (**(code **)((long)&stream_drivers[0].listener_alloc + lVar3))(lp,url);
  return iVar2;
}

Assistant:

int
nng_stream_listener_alloc_url(nng_stream_listener **lp, const nng_url *url)
{
	for (int i = 0; stream_drivers[i].scheme != NULL; i++) {
		if (strcmp(stream_drivers[i].scheme, url->u_scheme) == 0) {
			return (stream_drivers[i].listener_alloc(lp, url));
		}
	}
	return (NNG_ENOTSUP);
}